

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec3,int *ridx3,int *rn3,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps3)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  fpclass_type fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  cpp_dec_float<100U,_int,_void> *pcVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  int *piVar21;
  ulong uVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  uint local_a88 [3];
  undefined3 uStack_a7b;
  int iStack_a78;
  bool bStack_a74;
  undefined8 local_a70;
  ulong local_a68;
  int *local_a60;
  cpp_dec_float<100U,_int,_void> local_a58;
  cpp_dec_float<100U,_int,_void> local_a08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b0;
  int local_9a4;
  ulong local_9a0;
  cpp_dec_float<100U,_int,_void> local_998;
  int *local_940;
  int *local_938;
  int *local_930;
  pointer local_928;
  ulong local_920;
  int *local_918;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_910;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  uint local_8d8 [3];
  undefined3 uStack_8cb;
  int iStack_8c8;
  bool bStack_8c4;
  undefined8 local_8c0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8b0;
  undefined1 local_8a8 [24];
  uint auStack_890 [2];
  undefined1 local_888 [16];
  uint local_878 [3];
  undefined3 uStack_86b;
  int iStack_868;
  bool bStack_864;
  undefined8 local_860;
  undefined1 local_858 [24];
  uint auStack_840 [2];
  undefined1 local_838 [16];
  uint local_828 [3];
  undefined3 uStack_81b;
  int iStack_818;
  bool bStack_814;
  undefined8 local_810;
  undefined1 local_808 [24];
  uint auStack_7f0 [2];
  undefined1 local_7e8 [16];
  uint local_7d8 [3];
  undefined3 uStack_7cb;
  int iStack_7c8;
  bool bStack_7c4;
  undefined8 local_7c0;
  undefined1 local_7b8 [24];
  uint auStack_7a0 [2];
  undefined1 local_798 [16];
  uint local_788 [3];
  undefined3 uStack_77b;
  int iStack_778;
  bool bStack_774;
  undefined8 local_770;
  undefined1 local_768 [24];
  uint auStack_750 [2];
  undefined1 local_748 [16];
  uint local_738 [3];
  undefined3 uStack_72b;
  int iStack_728;
  bool bStack_724;
  undefined8 local_720;
  undefined1 local_718 [24];
  uint auStack_700 [2];
  undefined1 local_6f8 [16];
  uint local_6e8 [3];
  undefined3 uStack_6db;
  int iStack_6d8;
  bool bStack_6d4;
  undefined8 local_6d0;
  undefined1 local_6c8 [24];
  uint auStack_6b0 [2];
  undefined1 local_6a8 [16];
  uint local_698 [3];
  undefined3 uStack_68b;
  int iStack_688;
  bool bStack_684;
  undefined8 local_680;
  undefined1 local_678 [24];
  uint auStack_660 [2];
  undefined1 local_658 [16];
  uint local_648 [3];
  undefined3 uStack_63b;
  int iStack_638;
  bool bStack_634;
  undefined8 local_630;
  undefined1 local_628 [24];
  uint auStack_610 [2];
  undefined1 local_608 [16];
  uint local_5f8 [3];
  undefined3 uStack_5eb;
  int iStack_5e8;
  bool bStack_5e4;
  undefined8 local_5e0;
  undefined1 local_5d8 [24];
  uint auStack_5c0 [2];
  undefined1 local_5b8 [16];
  uint local_5a8 [3];
  undefined3 uStack_59b;
  int iStack_598;
  bool bStack_594;
  undefined8 local_590;
  undefined1 local_588 [24];
  uint auStack_570 [2];
  undefined1 local_568 [16];
  uint local_558 [3];
  undefined3 uStack_54b;
  int iStack_548;
  bool bStack_544;
  undefined8 local_540;
  undefined1 local_538 [24];
  uint auStack_520 [2];
  undefined1 local_518 [16];
  uint local_508 [3];
  undefined3 uStack_4fb;
  int iStack_4f8;
  bool bStack_4f4;
  undefined8 local_4f0;
  undefined1 local_4e8 [24];
  uint auStack_4d0 [2];
  undefined1 local_4c8 [16];
  uint local_4b8 [3];
  undefined3 uStack_4ab;
  int iStack_4a8;
  bool bStack_4a4;
  undefined8 local_4a0;
  undefined1 local_498 [24];
  uint auStack_480 [2];
  undefined1 local_478 [16];
  uint local_468 [3];
  undefined3 uStack_45b;
  int iStack_458;
  bool bStack_454;
  undefined8 local_450;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_998.fpclass = cpp_dec_float_finite;
  local_998.prec_elem = 0x10;
  local_998.data._M_elems[0] = 0;
  local_998.data._M_elems[1] = 0;
  local_998.data._M_elems[2] = 0;
  local_998.data._M_elems[3] = 0;
  local_998.data._M_elems[4] = 0;
  local_998.data._M_elems[5] = 0;
  local_998.data._M_elems[6] = 0;
  local_998.data._M_elems[7] = 0;
  local_998.data._M_elems[8] = 0;
  local_998.data._M_elems[9] = 0;
  local_998.data._M_elems[10] = 0;
  local_998.data._M_elems[0xb] = 0;
  local_998.data._M_elems[0xc] = 0;
  local_998.data._M_elems[0xd] = 0;
  local_998.data._M_elems._56_5_ = 0;
  uVar22 = 0;
  local_998.data._M_elems[0xf]._1_3_ = 0;
  local_998.exp = 0;
  local_998.neg = false;
  local_a08.fpclass = cpp_dec_float_finite;
  local_a08.prec_elem = 0x10;
  local_a08.data._M_elems[0] = 0;
  local_a08.data._M_elems[1] = 0;
  local_a08.data._M_elems[2] = 0;
  local_a08.data._M_elems[3] = 0;
  local_a08.data._M_elems[4] = 0;
  local_a08.data._M_elems[5] = 0;
  local_a08.data._M_elems[6] = 0;
  local_a08.data._M_elems[7] = 0;
  local_a08.data._M_elems[8] = 0;
  local_a08.data._M_elems[9] = 0;
  local_a08.data._M_elems[10] = 0;
  local_a08.data._M_elems[0xb] = 0;
  local_a08.data._M_elems[0xc] = 0;
  local_a08.data._M_elems[0xd] = 0;
  local_a08.data._M_elems._56_5_ = 0;
  local_a08.data._M_elems[0xf]._1_3_ = 0;
  local_a08.exp = 0;
  local_a08.neg = false;
  local_a58.fpclass = cpp_dec_float_finite;
  local_a58.prec_elem = 0x10;
  local_a58.data._M_elems[0] = 0;
  local_a58.data._M_elems[1] = 0;
  local_a58.data._M_elems[2] = 0;
  local_a58.data._M_elems[3] = 0;
  local_a58.data._M_elems[4] = 0;
  local_a58.data._M_elems[5] = 0;
  local_a58.data._M_elems[6] = 0;
  local_a58.data._M_elems[7] = 0;
  local_a58.data._M_elems[8] = 0;
  local_a58.data._M_elems[9] = 0;
  local_a58.data._M_elems[10] = 0;
  local_a58.data._M_elems[0xb] = 0;
  local_a58.data._M_elems[0xc] = 0;
  local_a58.data._M_elems[0xd] = 0;
  local_a58.data._M_elems._56_5_ = 0;
  local_a58.data._M_elems[0xf]._1_3_ = 0;
  local_a58.exp = 0;
  local_a58.neg = false;
  local_928 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_930 = (this->l).idx;
  local_918 = (this->l).row;
  local_a60 = (this->l).start;
  local_920 = (ulong)(this->l).firstUpdate;
  local_9b8 = vec;
  local_9b0 = vec2;
  local_940 = ridx;
  local_938 = rn;
  local_910 = eps;
  if (0 < (long)local_920) {
    uVar22 = 0;
    local_8b0 = this;
    do {
      iVar14 = local_918[uVar22];
      local_998.data._M_elems._0_8_ = *(undefined8 *)local_9b8[iVar14].m_backend.data._M_elems;
      local_998.data._M_elems._8_8_ = *(undefined8 *)(local_9b8[iVar14].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 4;
      local_998.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_998.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 8;
      local_998.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_998.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 0xc;
      local_998.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_998.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_998.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      iStack_a78 = local_9b8[iVar14].m_backend.exp;
      local_998.neg = local_9b8[iVar14].m_backend.neg;
      local_998.fpclass = local_9b8[iVar14].m_backend.fpclass;
      local_998.prec_elem = local_9b8[iVar14].m_backend.prec_elem;
      local_a08.data._M_elems._0_8_ = *(undefined8 *)local_9b0[iVar14].m_backend.data._M_elems;
      local_a08.data._M_elems._8_8_ = *(undefined8 *)(local_9b0[iVar14].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_9b0[iVar14].m_backend.data._M_elems + 4;
      local_a08.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a08.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b0[iVar14].m_backend.data._M_elems + 8;
      local_a08.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_a08.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b0[iVar14].m_backend.data._M_elems + 0xc;
      local_a08.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_a08.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_a08.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_a08.exp = local_9b0[iVar14].m_backend.exp;
      local_a08.neg = local_9b0[iVar14].m_backend.neg;
      local_a08.fpclass = local_9b0[iVar14].m_backend.fpclass;
      local_a08.prec_elem = local_9b0[iVar14].m_backend.prec_elem;
      local_a58.data._M_elems._0_8_ = *(undefined8 *)vec3[iVar14].m_backend.data._M_elems;
      local_a58.data._M_elems._8_8_ = *(undefined8 *)(vec3[iVar14].m_backend.data._M_elems + 2);
      puVar1 = vec3[iVar14].m_backend.data._M_elems + 4;
      local_a58.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a58.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec3[iVar14].m_backend.data._M_elems + 8;
      local_a58.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_a58.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec3[iVar14].m_backend.data._M_elems + 0xc;
      local_a58.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_a58.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_a58.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_a58.exp = vec3[iVar14].m_backend.exp;
      local_a58.neg = vec3[iVar14].m_backend.neg;
      local_a58.fpclass = vec3[iVar14].m_backend.fpclass;
      local_a58.prec_elem = vec3[iVar14].m_backend.prec_elem;
      local_ab8._0_8_ = *(undefined8 *)local_9b8[iVar14].m_backend.data._M_elems;
      local_ab8._8_8_ = *(undefined8 *)(local_9b8[iVar14].m_backend.data._M_elems + 2);
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 4;
      local_aa8._0_8_ = *(undefined8 *)puVar1;
      local_aa8._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 8;
      local_a98._0_8_ = *(undefined8 *)puVar1;
      local_a98._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_9b8[iVar14].m_backend.data._M_elems + 0xc;
      local_a88._0_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffff580 = (undefined5)uVar3;
      uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(local_910->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 0xc);
      local_88.data._M_elems._56_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 0xe);
      local_88.exp = (local_910->m_backend).exp;
      local_88.neg = (local_910->m_backend).neg;
      local_88.fpclass = (local_910->m_backend).fpclass;
      local_88.prec_elem = (local_910->m_backend).prec_elem;
      local_a70._4_4_ = local_998.prec_elem;
      local_a70._0_4_ = local_998.fpclass;
      bStack_a74 = local_998.neg;
      if ((local_998.neg == true) &&
         (local_ab8._0_4_ != 0 || local_998.fpclass != cpp_dec_float_finite)) {
        bStack_a74 = false;
      }
      local_9a0 = uVar22;
      local_998.exp = iStack_a78;
      if ((local_88.fpclass == cpp_dec_float_NaN || local_998.fpclass == cpp_dec_float_NaN) ||
         (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_88), iVar14 < 1)) {
        local_a88[0] = local_a08.data._M_elems[0xc];
        local_a88[1] = local_a08.data._M_elems[0xd];
        stack0xfffffffffffff580 = local_a08.data._M_elems._56_5_;
        uStack_a7b = local_a08.data._M_elems[0xf]._1_3_;
        local_a98._0_4_ = local_a08.data._M_elems[8];
        local_a98._4_4_ = local_a08.data._M_elems[9];
        local_a98._8_4_ = local_a08.data._M_elems[10];
        local_a98._12_4_ = local_a08.data._M_elems[0xb];
        local_aa8._0_4_ = local_a08.data._M_elems[4];
        local_aa8._4_4_ = local_a08.data._M_elems[5];
        local_aa8._8_4_ = local_a08.data._M_elems[6];
        local_aa8._12_4_ = local_a08.data._M_elems[7];
        local_ab8._0_4_ = local_a08.data._M_elems[0];
        local_ab8._4_4_ = local_a08.data._M_elems[1];
        uVar3 = local_ab8._0_8_;
        local_ab8._8_4_ = local_a08.data._M_elems[2];
        local_ab8._12_4_ = local_a08.data._M_elems[3];
        local_1c8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_1c8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_1c8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_1c8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_1c8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_1c8.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_1c8.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_1c8.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        local_1c8.exp = (eps2->m_backend).exp;
        local_1c8.neg = (eps2->m_backend).neg;
        local_1c8.fpclass = (eps2->m_backend).fpclass;
        local_1c8.prec_elem = (eps2->m_backend).prec_elem;
        iStack_a78 = local_a08.exp;
        bStack_a74 = local_a08.neg;
        local_a70._0_4_ = local_a08.fpclass;
        local_a70._4_4_ = local_a08.prec_elem;
        if ((local_a08.neg == true) &&
           (local_ab8._0_4_ = local_a08.data._M_elems[0],
           local_ab8._0_4_ != 0 || local_a08.fpclass != cpp_dec_float_finite)) {
          bStack_a74 = false;
        }
        if ((local_1c8.fpclass == cpp_dec_float_NaN || local_a08.fpclass == cpp_dec_float_NaN) ||
           (local_ab8._0_8_ = uVar3,
           iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_1c8), iVar14 < 1))
        {
          local_a88[0] = local_a58.data._M_elems[0xc];
          local_a88[1] = local_a58.data._M_elems[0xd];
          stack0xfffffffffffff580 = local_a58.data._M_elems._56_5_;
          uStack_a7b = local_a58.data._M_elems[0xf]._1_3_;
          local_a98._8_4_ = local_a58.data._M_elems[10];
          local_a98._12_4_ = local_a58.data._M_elems[0xb];
          local_a98._0_4_ = local_a58.data._M_elems[8];
          local_a98._4_4_ = local_a58.data._M_elems[9];
          local_aa8._8_4_ = local_a58.data._M_elems[6];
          local_aa8._12_4_ = local_a58.data._M_elems[7];
          local_aa8._0_4_ = local_a58.data._M_elems[4];
          local_aa8._4_4_ = local_a58.data._M_elems[5];
          local_ab8._8_4_ = local_a58.data._M_elems[2];
          local_ab8._12_4_ = local_a58.data._M_elems[3];
          local_ab8._0_4_ = local_a58.data._M_elems[0];
          local_ab8._4_4_ = local_a58.data._M_elems[1];
          auVar4 = local_ab8;
          local_268.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_268.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_268.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_268.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_268.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_268.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_268.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_268.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_268.exp = (eps3->m_backend).exp;
          local_268.neg = (eps3->m_backend).neg;
          local_268.fpclass = (eps3->m_backend).fpclass;
          local_268.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a78 = local_a58.exp;
          bStack_a74 = local_a58.neg;
          local_a70._0_4_ = local_a58.fpclass;
          local_a70._4_4_ = local_a58.prec_elem;
          if ((local_a58.neg == true) &&
             (local_ab8._0_4_ = local_a58.data._M_elems[0],
             local_ab8._0_4_ != 0 || local_a58.fpclass != cpp_dec_float_finite)) {
            bStack_a74 = false;
          }
          if ((local_268.fpclass != cpp_dec_float_NaN && local_a58.fpclass != cpp_dec_float_NaN) &&
             (local_ab8 = auVar4,
             iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_268), 0 < iVar14
             )) {
            iVar14 = local_a60[local_9a0];
            iVar16 = local_a60[local_9a0 + 1];
            if (iVar14 < iVar16) {
              pcVar20 = &local_928[iVar14].m_backend;
              piVar21 = local_930 + iVar14;
              do {
                iVar15 = *piVar21;
                local_7c0._0_4_ = cpp_dec_float_finite;
                local_7c0._4_4_ = 0x10;
                local_808._0_16_ = (undefined1  [16])0x0;
                stack0xfffffffffffff808 = (undefined1  [16])0x0;
                local_7e8 = (undefined1  [16])0x0;
                local_7d8[0] = 0;
                local_7d8[1] = 0;
                stack0xfffffffffffff830 = 0;
                uStack_7cb = 0;
                iStack_7c8 = 0;
                bStack_7c4 = false;
                pcVar19 = &local_a58;
                if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_808) {
                  local_7d8[0] = local_a58.data._M_elems[0xc];
                  local_7d8[1] = local_a58.data._M_elems[0xd];
                  stack0xfffffffffffff830 = local_a58.data._M_elems._56_5_;
                  uStack_7cb = local_a58.data._M_elems[0xf]._1_3_;
                  local_7e8._8_4_ = local_a58.data._M_elems[10];
                  local_7e8._12_4_ = local_a58.data._M_elems[0xb];
                  local_7e8._0_4_ = local_a58.data._M_elems[8];
                  local_7e8._4_4_ = local_a58.data._M_elems[9];
                  auStack_7f0[0] = local_a58.data._M_elems[6];
                  auStack_7f0[1] = local_a58.data._M_elems[7];
                  local_808._16_4_ = local_a58.data._M_elems[4];
                  local_808._20_4_ = local_a58.data._M_elems[5];
                  local_808._8_4_ = local_a58.data._M_elems[2];
                  local_808._12_4_ = local_a58.data._M_elems[3];
                  local_808._0_4_ = local_a58.data._M_elems[0];
                  local_808._4_4_ = local_a58.data._M_elems[1];
                  iStack_7c8 = local_a58.exp;
                  bStack_7c4 = local_a58.neg;
                  local_7c0._0_4_ = local_a58.fpclass;
                  local_7c0._4_4_ = local_a58.prec_elem;
                  pcVar19 = pcVar20;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_808,pcVar19);
                pcVar19 = &vec3[iVar15].m_backend;
                if (vec3[iVar15].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_a70._0_4_ = cpp_dec_float_finite;
                  local_a70._4_4_ = 0x10;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98 = (undefined1  [16])0x0;
                  local_a88[0] = 0;
                  local_a88[1] = 0;
                  stack0xfffffffffffff580 = 0;
                  uStack_a7b = 0;
                  iStack_a78 = 0;
                  bStack_a74 = false;
                  pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                  local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                  local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                  local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                  stack0xfffffffffffff580 = (undefined5)uVar3;
                  uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                  iStack_a78 = pcVar18->exp;
                  bStack_a74 = pcVar18->neg;
                  local_a70._0_4_ = pcVar18->fpclass;
                  local_a70._4_4_ = pcVar18->prec_elem;
                  iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                  if (iVar17 == 0) {
                    ridx3[*rn3] = iVar15;
                    *rn3 = *rn3 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_808);
                if (pcVar19->fpclass != cpp_dec_float_NaN) {
                  local_a70._0_4_ = cpp_dec_float_finite;
                  local_a70._4_4_ = 0x10;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98 = (undefined1  [16])0x0;
                  local_a88[0] = 0;
                  local_a88[1] = 0;
                  stack0xfffffffffffff580 = 0;
                  uStack_a7b = 0;
                  iStack_a78 = 0;
                  bStack_a74 = false;
                  pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                  local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                  local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                  local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                  stack0xfffffffffffff580 = (undefined5)uVar3;
                  uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                  iStack_a78 = pcVar18->exp;
                  bStack_a74 = pcVar18->neg;
                  local_a70._0_4_ = pcVar18->fpclass;
                  local_a70._4_4_ = pcVar18->prec_elem;
                  iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                  if (iVar15 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                              ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                  }
                }
                piVar21 = piVar21 + 1;
                pcVar20 = pcVar20 + 1;
                iVar16 = iVar16 + -1;
              } while (iVar14 < iVar16);
            }
          }
        }
        else {
          local_a68 = (ulong)local_a60[uVar22];
          local_a88[0] = local_a58.data._M_elems[0xc];
          local_a88[1] = local_a58.data._M_elems[0xd];
          stack0xfffffffffffff580 = local_a58.data._M_elems._56_5_;
          uStack_a7b = local_a58.data._M_elems[0xf]._1_3_;
          local_a98._8_4_ = local_a58.data._M_elems[10];
          local_a98._12_4_ = local_a58.data._M_elems[0xb];
          local_a98._0_4_ = local_a58.data._M_elems[8];
          local_a98._4_4_ = local_a58.data._M_elems[9];
          local_aa8._8_4_ = local_a58.data._M_elems[6];
          local_aa8._12_4_ = local_a58.data._M_elems[7];
          local_aa8._0_4_ = local_a58.data._M_elems[4];
          local_aa8._4_4_ = local_a58.data._M_elems[5];
          local_ab8._8_4_ = local_a58.data._M_elems[2];
          local_ab8._12_4_ = local_a58.data._M_elems[3];
          local_ab8._0_4_ = local_a58.data._M_elems[0];
          local_ab8._4_4_ = local_a58.data._M_elems[1];
          auVar4 = local_ab8;
          local_218.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_218.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_218.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_218.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_218.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_218.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_218.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_218.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_218.exp = (eps3->m_backend).exp;
          local_218.neg = (eps3->m_backend).neg;
          local_218.fpclass = (eps3->m_backend).fpclass;
          local_218.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a78 = local_a58.exp;
          bStack_a74 = local_a58.neg;
          local_a70._0_4_ = local_a58.fpclass;
          local_a70._4_4_ = local_a58.prec_elem;
          if ((local_a58.neg == true) &&
             (local_ab8._0_4_ = local_a58.data._M_elems[0],
             local_ab8._0_4_ != 0 || local_a58.fpclass != cpp_dec_float_finite)) {
            bStack_a74 = false;
          }
          piVar21 = local_930 + local_a68;
          pcVar20 = &local_928[local_a68].m_backend;
          local_ab8 = auVar4;
          if ((local_218.fpclass == cpp_dec_float_NaN || local_a58.fpclass == cpp_dec_float_NaN) ||
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_218),
             iVar14 < 1)) {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_770._0_4_ = cpp_dec_float_finite;
              local_770._4_4_ = 0x10;
              local_7b8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff858 = (undefined1  [16])0x0;
              local_798 = (undefined1  [16])0x0;
              local_788[0] = 0;
              local_788[1] = 0;
              stack0xfffffffffffff880 = 0;
              uStack_77b = 0;
              iStack_778 = 0;
              bStack_774 = false;
              pcVar19 = &local_a08;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_7b8) {
                local_788[0] = local_a08.data._M_elems[0xc];
                local_788[1] = local_a08.data._M_elems[0xd];
                stack0xfffffffffffff880 = local_a08.data._M_elems._56_5_;
                uStack_77b = local_a08.data._M_elems[0xf]._1_3_;
                local_798._8_4_ = local_a08.data._M_elems[10];
                local_798._12_4_ = local_a08.data._M_elems[0xb];
                local_798._0_4_ = local_a08.data._M_elems[8];
                local_798._4_4_ = local_a08.data._M_elems[9];
                auStack_7a0[0] = local_a08.data._M_elems[6];
                auStack_7a0[1] = local_a08.data._M_elems[7];
                local_7b8._16_4_ = local_a08.data._M_elems[4];
                local_7b8._20_4_ = local_a08.data._M_elems[5];
                local_7b8._8_4_ = local_a08.data._M_elems[2];
                local_7b8._12_4_ = local_a08.data._M_elems[3];
                local_7b8._0_4_ = local_a08.data._M_elems[0];
                local_7b8._4_4_ = local_a08.data._M_elems[1];
                iStack_778 = local_a08.exp;
                bStack_774 = local_a08.neg;
                local_770._0_4_ = local_a08.fpclass;
                local_770._4_4_ = local_a08.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_7b8,pcVar19);
              pcVar19 = &local_9b0[iVar16].m_backend;
              if (local_9b0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx2[*rn2] = iVar16;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_7b8);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
          else {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_6d0._0_4_ = cpp_dec_float_finite;
              local_6d0._4_4_ = 0x10;
              local_718._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff8f8 = (undefined1  [16])0x0;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8[0] = 0;
              local_6e8[1] = 0;
              stack0xfffffffffffff920 = 0;
              uStack_6db = 0;
              iStack_6d8 = 0;
              bStack_6d4 = false;
              pcVar19 = &local_a08;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_718) {
                local_6e8[0] = local_a08.data._M_elems[0xc];
                local_6e8[1] = local_a08.data._M_elems[0xd];
                stack0xfffffffffffff920 = local_a08.data._M_elems._56_5_;
                uStack_6db = local_a08.data._M_elems[0xf]._1_3_;
                local_6f8._8_4_ = local_a08.data._M_elems[10];
                local_6f8._12_4_ = local_a08.data._M_elems[0xb];
                local_6f8._0_4_ = local_a08.data._M_elems[8];
                local_6f8._4_4_ = local_a08.data._M_elems[9];
                auStack_700[0] = local_a08.data._M_elems[6];
                auStack_700[1] = local_a08.data._M_elems[7];
                local_718._16_4_ = local_a08.data._M_elems[4];
                local_718._20_4_ = local_a08.data._M_elems[5];
                local_718._8_4_ = local_a08.data._M_elems[2];
                local_718._12_4_ = local_a08.data._M_elems[3];
                local_718._0_4_ = local_a08.data._M_elems[0];
                local_718._4_4_ = local_a08.data._M_elems[1];
                iStack_6d8 = local_a08.exp;
                bStack_6d4 = local_a08.neg;
                local_6d0._0_4_ = local_a08.fpclass;
                local_6d0._4_4_ = local_a08.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_718,pcVar19);
              pcVar19 = &local_9b0[iVar16].m_backend;
              if (local_9b0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx2[*rn2] = iVar16;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_718);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              local_720._0_4_ = cpp_dec_float_finite;
              local_720._4_4_ = 0x10;
              local_768._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff8a8 = (undefined1  [16])0x0;
              local_748 = (undefined1  [16])0x0;
              local_738[0] = 0;
              local_738[1] = 0;
              stack0xfffffffffffff8d0 = 0;
              uStack_72b = 0;
              iStack_728 = 0;
              bStack_724 = false;
              pcVar19 = &local_a58;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_768) {
                local_738[0] = local_a58.data._M_elems[0xc];
                local_738[1] = local_a58.data._M_elems[0xd];
                stack0xfffffffffffff8d0 = local_a58.data._M_elems._56_5_;
                uStack_72b = local_a58.data._M_elems[0xf]._1_3_;
                local_748._8_4_ = local_a58.data._M_elems[10];
                local_748._12_4_ = local_a58.data._M_elems[0xb];
                local_748._0_4_ = local_a58.data._M_elems[8];
                local_748._4_4_ = local_a58.data._M_elems[9];
                auStack_750[0] = local_a58.data._M_elems[6];
                auStack_750[1] = local_a58.data._M_elems[7];
                local_768._16_4_ = local_a58.data._M_elems[4];
                local_768._20_4_ = local_a58.data._M_elems[5];
                local_768._8_4_ = local_a58.data._M_elems[2];
                local_768._12_4_ = local_a58.data._M_elems[3];
                local_768._0_4_ = local_a58.data._M_elems[0];
                local_768._4_4_ = local_a58.data._M_elems[1];
                iStack_728 = local_a58.exp;
                bStack_724 = local_a58.neg;
                local_720._0_4_ = local_a58.fpclass;
                local_720._4_4_ = local_a58.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_768,pcVar19);
              pcVar19 = &vec3[iVar16].m_backend;
              if (vec3[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx3[*rn3] = iVar16;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_768);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
        }
      }
      else {
        local_a68 = (ulong)local_a60[uVar22];
        local_a88[0] = local_a08.data._M_elems[0xc];
        local_a88[1] = local_a08.data._M_elems[0xd];
        stack0xfffffffffffff580 = local_a08.data._M_elems._56_5_;
        uStack_a7b = local_a08.data._M_elems[0xf]._1_3_;
        local_a98._0_4_ = local_a08.data._M_elems[8];
        local_a98._4_4_ = local_a08.data._M_elems[9];
        local_a98._8_4_ = local_a08.data._M_elems[10];
        local_a98._12_4_ = local_a08.data._M_elems[0xb];
        local_aa8._0_4_ = local_a08.data._M_elems[4];
        local_aa8._4_4_ = local_a08.data._M_elems[5];
        local_aa8._8_4_ = local_a08.data._M_elems[6];
        local_aa8._12_4_ = local_a08.data._M_elems[7];
        local_ab8._0_4_ = local_a08.data._M_elems[0];
        local_ab8._4_4_ = local_a08.data._M_elems[1];
        uVar3 = local_ab8._0_8_;
        local_ab8._8_4_ = local_a08.data._M_elems[2];
        local_ab8._12_4_ = local_a08.data._M_elems[3];
        local_d8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_d8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_d8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_d8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_d8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_d8.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_d8.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_d8.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        local_d8.exp = (eps2->m_backend).exp;
        local_d8.neg = (eps2->m_backend).neg;
        local_d8.fpclass = (eps2->m_backend).fpclass;
        local_d8.prec_elem = (eps2->m_backend).prec_elem;
        iStack_a78 = local_a08.exp;
        bStack_a74 = local_a08.neg;
        local_a70._0_4_ = local_a08.fpclass;
        local_a70._4_4_ = local_a08.prec_elem;
        if ((local_a08.neg == true) &&
           (local_ab8._0_4_ = local_a08.data._M_elems[0],
           local_ab8._0_4_ != 0 || local_a08.fpclass != cpp_dec_float_finite)) {
          bStack_a74 = false;
        }
        piVar21 = local_930 + local_a68;
        pcVar20 = &local_928[local_a68].m_backend;
        if ((local_d8.fpclass == cpp_dec_float_NaN || local_a08.fpclass == cpp_dec_float_NaN) ||
           (local_ab8._0_8_ = uVar3,
           iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_d8), iVar14 < 1))
        {
          local_a88[0] = local_a58.data._M_elems[0xc];
          local_a88[1] = local_a58.data._M_elems[0xd];
          stack0xfffffffffffff580 = local_a58.data._M_elems._56_5_;
          uStack_a7b = local_a58.data._M_elems[0xf]._1_3_;
          local_a98._8_4_ = local_a58.data._M_elems[10];
          local_a98._12_4_ = local_a58.data._M_elems[0xb];
          local_a98._0_4_ = local_a58.data._M_elems[8];
          local_a98._4_4_ = local_a58.data._M_elems[9];
          local_aa8._8_4_ = local_a58.data._M_elems[6];
          local_aa8._12_4_ = local_a58.data._M_elems[7];
          local_aa8._0_4_ = local_a58.data._M_elems[4];
          local_aa8._4_4_ = local_a58.data._M_elems[5];
          local_ab8._8_4_ = local_a58.data._M_elems[2];
          local_ab8._12_4_ = local_a58.data._M_elems[3];
          local_ab8._0_4_ = local_a58.data._M_elems[0];
          local_ab8._4_4_ = local_a58.data._M_elems[1];
          auVar4 = local_ab8;
          local_178.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_178.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_178.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_178.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_178.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_178.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_178.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_178.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_178.exp = (eps3->m_backend).exp;
          local_178.neg = (eps3->m_backend).neg;
          local_178.fpclass = (eps3->m_backend).fpclass;
          local_178.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a78 = local_a58.exp;
          bStack_a74 = local_a58.neg;
          local_a70._0_4_ = local_a58.fpclass;
          local_a70._4_4_ = local_a58.prec_elem;
          if ((local_a58.neg == true) &&
             (local_ab8._0_4_ = local_a58.data._M_elems[0],
             local_ab8._0_4_ != 0 || local_a58.fpclass != cpp_dec_float_finite)) {
            bStack_a74 = false;
          }
          local_ab8 = auVar4;
          if ((local_178.fpclass == cpp_dec_float_NaN || local_a58.fpclass == cpp_dec_float_NaN) ||
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_178),
             iVar14 < 1)) {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_680._0_4_ = cpp_dec_float_finite;
              local_680._4_4_ = 0x10;
              local_6c8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff948 = (undefined1  [16])0x0;
              local_6a8 = (undefined1  [16])0x0;
              local_698[0] = 0;
              local_698[1] = 0;
              stack0xfffffffffffff970 = 0;
              uStack_68b = 0;
              iStack_688 = 0;
              bStack_684 = false;
              pcVar19 = &local_998;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_6c8) {
                local_698[0] = local_998.data._M_elems[0xc];
                local_698[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffff970 = local_998.data._M_elems._56_5_;
                uStack_68b = local_998.data._M_elems[0xf]._1_3_;
                local_6a8._8_4_ = local_998.data._M_elems[10];
                local_6a8._12_4_ = local_998.data._M_elems[0xb];
                local_6a8._0_4_ = local_998.data._M_elems[8];
                local_6a8._4_4_ = local_998.data._M_elems[9];
                auStack_6b0[0] = local_998.data._M_elems[6];
                auStack_6b0[1] = local_998.data._M_elems[7];
                local_6c8._16_4_ = local_998.data._M_elems[4];
                local_6c8._20_4_ = local_998.data._M_elems[5];
                local_6c8._8_4_ = local_998.data._M_elems[2];
                local_6c8._12_4_ = local_998.data._M_elems[3];
                local_6c8._0_4_ = local_998.data._M_elems[0];
                local_6c8._4_4_ = local_998.data._M_elems[1];
                iStack_688 = local_998.exp;
                bStack_684 = local_998.neg;
                local_680._0_4_ = local_998.fpclass;
                local_680._4_4_ = local_998.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_6c8,pcVar19);
              pcVar19 = &local_9b8[iVar16].m_backend;
              if (local_9b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  local_940[*local_938] = iVar16;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_6c8);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
          else {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_5e0._0_4_ = cpp_dec_float_finite;
              local_5e0._4_4_ = 0x10;
              local_628._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff9e8 = (undefined1  [16])0x0;
              local_608 = (undefined1  [16])0x0;
              local_5f8[0] = 0;
              local_5f8[1] = 0;
              stack0xfffffffffffffa10 = 0;
              uStack_5eb = 0;
              iStack_5e8 = 0;
              bStack_5e4 = false;
              pcVar19 = &local_998;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_628) {
                local_5f8[0] = local_998.data._M_elems[0xc];
                local_5f8[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffffa10 = local_998.data._M_elems._56_5_;
                uStack_5eb = local_998.data._M_elems[0xf]._1_3_;
                local_608._8_4_ = local_998.data._M_elems[10];
                local_608._12_4_ = local_998.data._M_elems[0xb];
                local_608._0_4_ = local_998.data._M_elems[8];
                local_608._4_4_ = local_998.data._M_elems[9];
                auStack_610[0] = local_998.data._M_elems[6];
                auStack_610[1] = local_998.data._M_elems[7];
                local_628._16_4_ = local_998.data._M_elems[4];
                local_628._20_4_ = local_998.data._M_elems[5];
                local_628._8_4_ = local_998.data._M_elems[2];
                local_628._12_4_ = local_998.data._M_elems[3];
                local_628._0_4_ = local_998.data._M_elems[0];
                local_628._4_4_ = local_998.data._M_elems[1];
                iStack_5e8 = local_998.exp;
                bStack_5e4 = local_998.neg;
                local_5e0._0_4_ = local_998.fpclass;
                local_5e0._4_4_ = local_998.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_628,pcVar19);
              pcVar19 = &local_9b8[iVar16].m_backend;
              if (local_9b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  local_940[*local_938] = iVar16;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_628);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              local_630._0_4_ = cpp_dec_float_finite;
              local_630._4_4_ = 0x10;
              local_678._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff998 = (undefined1  [16])0x0;
              local_658 = (undefined1  [16])0x0;
              local_648[0] = 0;
              local_648[1] = 0;
              stack0xfffffffffffff9c0 = 0;
              uStack_63b = 0;
              iStack_638 = 0;
              bStack_634 = false;
              pcVar19 = &local_a58;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_678) {
                local_648[0] = local_a58.data._M_elems[0xc];
                local_648[1] = local_a58.data._M_elems[0xd];
                stack0xfffffffffffff9c0 = local_a58.data._M_elems._56_5_;
                uStack_63b = local_a58.data._M_elems[0xf]._1_3_;
                local_658._8_4_ = local_a58.data._M_elems[10];
                local_658._12_4_ = local_a58.data._M_elems[0xb];
                local_658._0_4_ = local_a58.data._M_elems[8];
                local_658._4_4_ = local_a58.data._M_elems[9];
                auStack_660[0] = local_a58.data._M_elems[6];
                auStack_660[1] = local_a58.data._M_elems[7];
                local_678._16_4_ = local_a58.data._M_elems[4];
                local_678._20_4_ = local_a58.data._M_elems[5];
                local_678._8_4_ = local_a58.data._M_elems[2];
                local_678._12_4_ = local_a58.data._M_elems[3];
                local_678._0_4_ = local_a58.data._M_elems[0];
                local_678._4_4_ = local_a58.data._M_elems[1];
                iStack_638 = local_a58.exp;
                bStack_634 = local_a58.neg;
                local_630._0_4_ = local_a58.fpclass;
                local_630._4_4_ = local_a58.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_678,pcVar19);
              pcVar19 = &vec3[iVar16].m_backend;
              if (vec3[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx3[*rn3] = iVar16;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_678);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
        }
        else {
          local_a88[0] = local_a58.data._M_elems[0xc];
          local_a88[1] = local_a58.data._M_elems[0xd];
          stack0xfffffffffffff580 = local_a58.data._M_elems._56_5_;
          uStack_a7b = local_a58.data._M_elems[0xf]._1_3_;
          local_a98._8_4_ = local_a58.data._M_elems[10];
          local_a98._12_4_ = local_a58.data._M_elems[0xb];
          local_a98._0_4_ = local_a58.data._M_elems[8];
          local_a98._4_4_ = local_a58.data._M_elems[9];
          local_aa8._8_4_ = local_a58.data._M_elems[6];
          local_aa8._12_4_ = local_a58.data._M_elems[7];
          local_aa8._0_4_ = local_a58.data._M_elems[4];
          local_aa8._4_4_ = local_a58.data._M_elems[5];
          local_ab8._8_4_ = local_a58.data._M_elems[2];
          local_ab8._12_4_ = local_a58.data._M_elems[3];
          local_ab8._0_4_ = local_a58.data._M_elems[0];
          local_ab8._4_4_ = local_a58.data._M_elems[1];
          auVar4 = local_ab8;
          local_128.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_128.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_128.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_128.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_128.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_128.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_128.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_128.exp = (eps3->m_backend).exp;
          local_128.neg = (eps3->m_backend).neg;
          local_128.fpclass = (eps3->m_backend).fpclass;
          local_128.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a78 = local_a58.exp;
          bStack_a74 = local_a58.neg;
          local_a70._0_4_ = local_a58.fpclass;
          local_a70._4_4_ = local_a58.prec_elem;
          if ((local_a58.neg == true) &&
             (local_ab8._0_4_ = local_a58.data._M_elems[0],
             local_ab8._0_4_ != 0 || local_a58.fpclass != cpp_dec_float_finite)) {
            bStack_a74 = false;
          }
          local_ab8 = auVar4;
          if ((local_128.fpclass == cpp_dec_float_NaN || local_a58.fpclass == cpp_dec_float_NaN) ||
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_128),
             iVar14 < 1)) {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_540._0_4_ = cpp_dec_float_finite;
              local_540._4_4_ = 0x10;
              local_588._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffa88 = (undefined1  [16])0x0;
              local_568 = (undefined1  [16])0x0;
              local_558[0] = 0;
              local_558[1] = 0;
              stack0xfffffffffffffab0 = 0;
              uStack_54b = 0;
              iStack_548 = 0;
              bStack_544 = false;
              pcVar19 = &local_998;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_588) {
                local_558[0] = local_998.data._M_elems[0xc];
                local_558[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffffab0 = local_998.data._M_elems._56_5_;
                uStack_54b = local_998.data._M_elems[0xf]._1_3_;
                local_568._8_4_ = local_998.data._M_elems[10];
                local_568._12_4_ = local_998.data._M_elems[0xb];
                local_568._0_4_ = local_998.data._M_elems[8];
                local_568._4_4_ = local_998.data._M_elems[9];
                auStack_570[0] = local_998.data._M_elems[6];
                auStack_570[1] = local_998.data._M_elems[7];
                local_588._16_4_ = local_998.data._M_elems[4];
                local_588._20_4_ = local_998.data._M_elems[5];
                local_588._8_4_ = local_998.data._M_elems[2];
                local_588._12_4_ = local_998.data._M_elems[3];
                local_588._0_4_ = local_998.data._M_elems[0];
                local_588._4_4_ = local_998.data._M_elems[1];
                iStack_548 = local_998.exp;
                bStack_544 = local_998.neg;
                local_540._0_4_ = local_998.fpclass;
                local_540._4_4_ = local_998.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_588,pcVar19);
              pcVar19 = &local_9b8[iVar16].m_backend;
              if (local_9b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  local_940[*local_938] = iVar16;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_588);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              local_590._0_4_ = cpp_dec_float_finite;
              local_590._4_4_ = 0x10;
              local_5d8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffa38 = (undefined1  [16])0x0;
              local_5b8 = (undefined1  [16])0x0;
              local_5a8[0] = 0;
              local_5a8[1] = 0;
              stack0xfffffffffffffa60 = 0;
              uStack_59b = 0;
              iStack_598 = 0;
              bStack_594 = false;
              pcVar19 = &local_a08;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_5d8) {
                local_5a8[0] = local_a08.data._M_elems[0xc];
                local_5a8[1] = local_a08.data._M_elems[0xd];
                stack0xfffffffffffffa60 = local_a08.data._M_elems._56_5_;
                uStack_59b = local_a08.data._M_elems[0xf]._1_3_;
                local_5b8._8_4_ = local_a08.data._M_elems[10];
                local_5b8._12_4_ = local_a08.data._M_elems[0xb];
                local_5b8._0_4_ = local_a08.data._M_elems[8];
                local_5b8._4_4_ = local_a08.data._M_elems[9];
                auStack_5c0[0] = local_a08.data._M_elems[6];
                auStack_5c0[1] = local_a08.data._M_elems[7];
                local_5d8._16_4_ = local_a08.data._M_elems[4];
                local_5d8._20_4_ = local_a08.data._M_elems[5];
                local_5d8._8_4_ = local_a08.data._M_elems[2];
                local_5d8._12_4_ = local_a08.data._M_elems[3];
                local_5d8._0_4_ = local_a08.data._M_elems[0];
                local_5d8._4_4_ = local_a08.data._M_elems[1];
                iStack_598 = local_a08.exp;
                bStack_594 = local_a08.neg;
                local_590._0_4_ = local_a08.fpclass;
                local_590._4_4_ = local_a08.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_5d8,pcVar19);
              pcVar19 = &local_9b0[iVar16].m_backend;
              if (local_9b0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx2[*rn2] = iVar16;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_5d8);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
          else {
            for (iVar14 = local_a60[uVar22 + 1]; (int)local_a68 < iVar14; iVar14 = iVar14 + -1) {
              iVar16 = *piVar21;
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x10;
              local_498._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffb78 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468[0] = 0;
              local_468[1] = 0;
              stack0xfffffffffffffba0 = 0;
              uStack_45b = 0;
              iStack_458 = 0;
              bStack_454 = false;
              pcVar19 = &local_998;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_498) {
                local_468[0] = local_998.data._M_elems[0xc];
                local_468[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffffba0 = local_998.data._M_elems._56_5_;
                uStack_45b = local_998.data._M_elems[0xf]._1_3_;
                local_478._8_4_ = local_998.data._M_elems[10];
                local_478._12_4_ = local_998.data._M_elems[0xb];
                local_478._0_4_ = local_998.data._M_elems[8];
                local_478._4_4_ = local_998.data._M_elems[9];
                auStack_480[0] = local_998.data._M_elems[6];
                auStack_480[1] = local_998.data._M_elems[7];
                local_498._16_4_ = local_998.data._M_elems[4];
                local_498._20_4_ = local_998.data._M_elems[5];
                local_498._8_4_ = local_998.data._M_elems[2];
                local_498._12_4_ = local_998.data._M_elems[3];
                local_498._0_4_ = local_998.data._M_elems[0];
                local_498._4_4_ = local_998.data._M_elems[1];
                iStack_458 = local_998.exp;
                bStack_454 = local_998.neg;
                local_450._0_4_ = local_998.fpclass;
                local_450._4_4_ = local_998.prec_elem;
                pcVar19 = pcVar20;
              }
              local_9a4 = iVar16;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_498,pcVar19);
              pcVar19 = &local_9b8[iVar16].m_backend;
              if (local_9b8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  local_940[*local_938] = local_9a4;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_498);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              local_4a0._0_4_ = cpp_dec_float_finite;
              local_4a0._4_4_ = 0x10;
              local_4e8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffb28 = (undefined1  [16])0x0;
              local_4c8 = (undefined1  [16])0x0;
              local_4b8[0] = 0;
              local_4b8[1] = 0;
              stack0xfffffffffffffb50 = 0;
              uStack_4ab = 0;
              iStack_4a8 = 0;
              bStack_4a4 = false;
              pcVar19 = &local_a08;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_4e8) {
                local_4b8[0] = local_a08.data._M_elems[0xc];
                local_4b8[1] = local_a08.data._M_elems[0xd];
                stack0xfffffffffffffb50 = local_a08.data._M_elems._56_5_;
                uStack_4ab = local_a08.data._M_elems[0xf]._1_3_;
                local_4c8._8_4_ = local_a08.data._M_elems[10];
                local_4c8._12_4_ = local_a08.data._M_elems[0xb];
                local_4c8._0_4_ = local_a08.data._M_elems[8];
                local_4c8._4_4_ = local_a08.data._M_elems[9];
                auStack_4d0[0] = local_a08.data._M_elems[6];
                auStack_4d0[1] = local_a08.data._M_elems[7];
                local_4e8._16_4_ = local_a08.data._M_elems[4];
                local_4e8._20_4_ = local_a08.data._M_elems[5];
                local_4e8._8_4_ = local_a08.data._M_elems[2];
                local_4e8._12_4_ = local_a08.data._M_elems[3];
                local_4e8._0_4_ = local_a08.data._M_elems[0];
                local_4e8._4_4_ = local_a08.data._M_elems[1];
                iStack_4a8 = local_a08.exp;
                bStack_4a4 = local_a08.neg;
                local_4a0._0_4_ = local_a08.fpclass;
                local_4a0._4_4_ = local_a08.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_4e8,pcVar19);
              pcVar19 = &local_9b0[iVar16].m_backend;
              if (local_9b0[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  ridx2[*rn2] = local_9a4;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_4e8);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar15 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              local_4f0._0_4_ = cpp_dec_float_finite;
              local_4f0._4_4_ = 0x10;
              local_538._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffad8 = (undefined1  [16])0x0;
              local_518 = (undefined1  [16])0x0;
              local_508[0] = 0;
              local_508[1] = 0;
              stack0xfffffffffffffb00 = 0;
              uStack_4fb = 0;
              iStack_4f8 = 0;
              bStack_4f4 = false;
              pcVar19 = &local_a58;
              if (pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_538) {
                local_508[0] = local_a58.data._M_elems[0xc];
                local_508[1] = local_a58.data._M_elems[0xd];
                stack0xfffffffffffffb00 = local_a58.data._M_elems._56_5_;
                uStack_4fb = local_a58.data._M_elems[0xf]._1_3_;
                local_518._8_4_ = local_a58.data._M_elems[10];
                local_518._12_4_ = local_a58.data._M_elems[0xb];
                local_518._0_4_ = local_a58.data._M_elems[8];
                local_518._4_4_ = local_a58.data._M_elems[9];
                auStack_520[0] = local_a58.data._M_elems[6];
                auStack_520[1] = local_a58.data._M_elems[7];
                local_538._16_4_ = local_a58.data._M_elems[4];
                local_538._20_4_ = local_a58.data._M_elems[5];
                local_538._8_4_ = local_a58.data._M_elems[2];
                local_538._12_4_ = local_a58.data._M_elems[3];
                local_538._0_4_ = local_a58.data._M_elems[0];
                local_538._4_4_ = local_a58.data._M_elems[1];
                iStack_4f8 = local_a58.exp;
                bStack_4f4 = local_a58.neg;
                local_4f0._0_4_ = local_a58.fpclass;
                local_4f0._4_4_ = local_a58.prec_elem;
                pcVar19 = pcVar20;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_538,pcVar19);
              pcVar19 = &vec3[iVar16].m_backend;
              if (vec3[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  ridx3[*rn3] = local_9a4;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_538);
              if (pcVar19->fpclass != cpp_dec_float_NaN) {
                local_a70._0_4_ = cpp_dec_float_finite;
                local_a70._4_4_ = 0x10;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98 = (undefined1  [16])0x0;
                local_a88[0] = 0;
                local_a88[1] = 0;
                stack0xfffffffffffff580 = 0;
                uStack_a7b = 0;
                iStack_a78 = 0;
                bStack_a74 = false;
                pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
                local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
                local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                stack0xfffffffffffff580 = (undefined5)uVar3;
                uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
                iStack_a78 = pcVar18->exp;
                bStack_a74 = pcVar18->neg;
                local_a70._0_4_ = pcVar18->fpclass;
                local_a70._4_4_ = pcVar18->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar19,(cpp_dec_float<100U,_int,_void> *)local_ab8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar19,1e-100);
                }
              }
              piVar21 = piVar21 + 1;
              pcVar20 = pcVar20 + 1;
            }
          }
        }
      }
      uVar22 = local_9a0 + 1;
      this = local_8b0;
    } while (uVar22 != local_920);
  }
  if (((this->l).updateType != 0) &&
     (uVar2 = (this->l).firstUnused, local_920 = (ulong)uVar2, (int)uVar22 < (int)uVar2)) {
    local_a68 = uVar22 & 0xffffffff;
    do {
      iVar14 = local_a60[local_a68];
      local_8c0._0_4_ = cpp_dec_float_finite;
      local_8c0._4_4_ = 0x10;
      local_908 = (undefined1  [16])0x0;
      local_8f8 = (undefined1  [16])0x0;
      local_8e8 = (undefined1  [16])0x0;
      local_8d8[0] = 0;
      local_8d8[1] = 0;
      stack0xfffffffffffff730 = 0;
      uStack_8cb = 0;
      iStack_8c8 = 0;
      bStack_8c4 = false;
      local_810._0_4_ = cpp_dec_float_finite;
      local_810._4_4_ = 0x10;
      local_858._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffff7b8 = (undefined1  [16])0x0;
      local_838 = (undefined1  [16])0x0;
      local_828[0] = 0;
      local_828[1] = 0;
      stack0xfffffffffffff7e0 = 0;
      uStack_81b = 0;
      iStack_818 = 0;
      bStack_814 = false;
      local_860._0_4_ = cpp_dec_float_finite;
      local_860._4_4_ = 0x10;
      local_8a8._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffff768 = (undefined1  [16])0x0;
      local_888 = (undefined1  [16])0x0;
      local_878[0] = 0;
      local_878[1] = 0;
      stack0xfffffffffffff790 = 0;
      uStack_86b = 0;
      iStack_868 = 0;
      bStack_864 = false;
      iVar16 = local_a60[local_a68 + 1];
      if (iVar14 < iVar16) {
        pcVar20 = &local_928[iVar14].m_backend;
        piVar21 = local_930 + iVar14;
        do {
          pcVar18 = &local_9b8[*piVar21].m_backend;
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = pcVar18;
          if ((pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_ab8) &&
             (pcVar19 = pcVar20, (cpp_dec_float<100U,_int,_void> *)local_ab8 != pcVar18)) {
            local_ab8 = *(undefined1 (*) [16])
                         (((cpp_dec_float<100U,_int,_void> *)&pcVar18->data)->data)._M_elems;
            local_aa8 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar18->data)->data)._M_elems + 4);
            local_a98 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar18->data)->data)._M_elems + 8);
            local_a88._0_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar18->data)->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)
                     ((((cpp_dec_float<100U,_int,_void> *)&pcVar18->data)->data)._M_elems + 0xe);
            stack0xfffffffffffff580 = (undefined5)uVar3;
            uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_a78 = pcVar18->exp;
            bStack_a74 = pcVar18->neg;
            local_a70._0_4_ = pcVar18->fpclass;
            local_a70._4_4_ = pcVar18->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ab8,pcVar19);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_908,
                     (cpp_dec_float<100U,_int,_void> *)local_ab8);
          pcVar18 = &local_9b0[*piVar21].m_backend;
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = pcVar18;
          if ((pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_ab8) &&
             (pcVar19 = pcVar20, (cpp_dec_float<100U,_int,_void> *)local_ab8 != pcVar18)) {
            local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
            local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
            local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
            local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
            stack0xfffffffffffff580 = (undefined5)uVar3;
            uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_a78 = pcVar18->exp;
            bStack_a74 = pcVar18->neg;
            local_a70._0_4_ = pcVar18->fpclass;
            local_a70._4_4_ = pcVar18->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ab8,pcVar19);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_858,
                     (cpp_dec_float<100U,_int,_void> *)local_ab8);
          pcVar18 = &vec3[*piVar21].m_backend;
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = pcVar18;
          if ((pcVar20 != (cpp_dec_float<100U,_int,_void> *)local_ab8) &&
             (pcVar19 = pcVar20, (cpp_dec_float<100U,_int,_void> *)local_ab8 != pcVar18)) {
            local_ab8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
            local_aa8 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
            local_a98 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
            local_a88._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
            stack0xfffffffffffff580 = (undefined5)uVar3;
            uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_a78 = pcVar18->exp;
            bStack_a74 = pcVar18->neg;
            local_a70._0_4_ = pcVar18->fpclass;
            local_a70._4_4_ = pcVar18->prec_elem;
          }
          piVar21 = piVar21 + 1;
          pcVar20 = pcVar20 + 1;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ab8,pcVar19);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_8a8,
                     (cpp_dec_float<100U,_int,_void> *)local_ab8);
          iVar16 = iVar16 + -1;
        } while (iVar14 < iVar16);
      }
      auVar11 = local_838;
      auVar10 = stack0xfffffffffffff7b8;
      auVar9 = local_858._0_16_;
      auVar8 = local_888;
      auVar7 = stack0xfffffffffffff768;
      auVar6 = local_8a8._0_16_;
      local_a98 = local_8e8;
      local_aa8 = local_8f8;
      local_ab8 = local_908;
      uVar22 = local_a68;
      local_998.data._M_elems[0xc] = local_8d8[0];
      local_998.data._M_elems[0xd] = local_8d8[1];
      local_998.data._M_elems._56_5_ = stack0xfffffffffffff730;
      local_998.data._M_elems[0xf]._1_3_ = uStack_8cb;
      local_998.data._M_elems[8] = local_8e8._0_4_;
      local_998.data._M_elems[9] = local_8e8._4_4_;
      uVar13 = local_998.data._M_elems._32_8_;
      local_998.data._M_elems[8] = local_8e8._0_4_;
      local_998.data._M_elems[9] = local_8e8._4_4_;
      local_998.data._M_elems[10] = local_8e8._8_4_;
      local_998.data._M_elems[0xb] = local_8e8._12_4_;
      local_998.data._M_elems[4] = local_8f8._0_4_;
      local_998.data._M_elems[5] = local_8f8._4_4_;
      uVar12 = local_998.data._M_elems._16_8_;
      local_998.data._M_elems[4] = local_8f8._0_4_;
      local_998.data._M_elems[5] = local_8f8._4_4_;
      local_998.data._M_elems[6] = local_8f8._8_4_;
      local_998.data._M_elems[7] = local_8f8._12_4_;
      local_998.data._M_elems[0] = local_908._0_4_;
      local_998.data._M_elems[1] = local_908._4_4_;
      uVar3 = local_998.data._M_elems._0_8_;
      local_998.data._M_elems[0] = local_908._0_4_;
      local_998.data._M_elems[1] = local_908._4_4_;
      local_998.data._M_elems[2] = local_908._8_4_;
      local_998.data._M_elems[3] = local_908._12_4_;
      fVar5 = (fpclass_type)local_8c0;
      local_998.exp = iStack_8c8;
      local_998.neg = bStack_8c4;
      local_998.fpclass = (fpclass_type)local_8c0;
      local_998.prec_elem = local_8c0._4_4_;
      local_a08.data._M_elems[0] = local_858._0_4_;
      local_a08.data._M_elems[1] = local_858._4_4_;
      local_a08.data._M_elems[2] = local_858._8_4_;
      local_a08.data._M_elems[3] = local_858._12_4_;
      local_a08.data._M_elems[4] = local_858._16_4_;
      local_a08.data._M_elems[5] = local_858._20_4_;
      local_a08.data._M_elems[6] = auStack_840[0];
      local_a08.data._M_elems[7] = auStack_840[1];
      local_a08.data._M_elems[8] = local_838._0_4_;
      local_a08.data._M_elems[9] = local_838._4_4_;
      local_a08.data._M_elems[10] = local_838._8_4_;
      local_a08.data._M_elems[0xb] = local_838._12_4_;
      local_a08.data._M_elems[0xc] = local_828[0];
      local_a08.data._M_elems[0xd] = local_828[1];
      local_a08.data._M_elems._56_5_ = stack0xfffffffffffff7e0;
      local_a08.data._M_elems[0xf]._1_3_ = uStack_81b;
      local_a08.exp = iStack_818;
      local_a08.neg = bStack_814;
      local_a08.fpclass = (fpclass_type)local_810;
      local_a08.prec_elem = local_810._4_4_;
      local_a58.data._M_elems[0] = local_8a8._0_4_;
      local_a58.data._M_elems[1] = local_8a8._4_4_;
      local_a58.data._M_elems[2] = local_8a8._8_4_;
      local_a58.data._M_elems[3] = local_8a8._12_4_;
      local_a58.data._M_elems[4] = local_8a8._16_4_;
      local_a58.data._M_elems[5] = local_8a8._20_4_;
      local_a58.data._M_elems[6] = auStack_890[0];
      local_a58.data._M_elems[7] = auStack_890[1];
      local_a58.data._M_elems[8] = local_888._0_4_;
      local_a58.data._M_elems[9] = local_888._4_4_;
      local_a58.data._M_elems[10] = local_888._8_4_;
      local_a58.data._M_elems[0xb] = local_888._12_4_;
      local_a58.data._M_elems[0xc] = local_878[0];
      local_a58.data._M_elems[0xd] = local_878[1];
      local_a58.data._M_elems._56_5_ = stack0xfffffffffffff790;
      local_a58.data._M_elems[0xf]._1_3_ = uStack_86b;
      local_a58.exp = iStack_868;
      local_a58.neg = bStack_864;
      local_a58.fpclass = (fpclass_type)local_860;
      local_a58.prec_elem = local_860._4_4_;
      iVar14 = local_918[local_a68];
      local_a88[0] = local_8d8[0];
      local_a88[1] = local_8d8[1];
      stack0xfffffffffffff580 = stack0xfffffffffffff730;
      uStack_a7b = uStack_8cb;
      auVar4 = local_ab8;
      local_2b8.data._M_elems._0_8_ = *(undefined8 *)(local_910->m_backend).data._M_elems;
      local_2b8.data._M_elems._8_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 2);
      local_2b8.data._M_elems._16_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 4);
      local_2b8.data._M_elems._24_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 6);
      local_2b8.data._M_elems._32_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 8);
      local_2b8.data._M_elems._40_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 10);
      local_2b8.data._M_elems._48_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 0xc);
      local_2b8.data._M_elems._56_8_ = *(undefined8 *)((local_910->m_backend).data._M_elems + 0xe);
      local_2b8.exp = (local_910->m_backend).exp;
      local_2b8.neg = (local_910->m_backend).neg;
      local_2b8.fpclass = (local_910->m_backend).fpclass;
      local_2b8.prec_elem = (local_910->m_backend).prec_elem;
      iStack_a78 = iStack_8c8;
      bStack_a74 = bStack_8c4;
      local_a70._0_4_ = (fpclass_type)local_8c0;
      local_a70._4_4_ = local_8c0._4_4_;
      if ((bStack_8c4 == true) && (local_ab8._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
        bStack_a74 = false;
      }
      local_9a0 = CONCAT44(local_9a0._4_4_,iVar14);
      local_908 = local_ab8;
      local_8f8 = local_aa8;
      local_8e8 = local_a98;
      local_8a8._0_16_ = auVar6;
      unique0x1000a5bb = auVar7;
      local_888 = auVar8;
      local_858._0_16_ = auVar9;
      unique0x1000a61b = auVar10;
      local_838 = auVar11;
      if ((local_2b8.fpclass != cpp_dec_float_NaN && fVar5 != cpp_dec_float_NaN) &&
         (local_ab8 = auVar4,
         iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_2b8),
         uVar3 = local_998.data._M_elems._0_8_, uVar12 = local_998.data._M_elems._16_8_,
         uVar13 = local_998.data._M_elems._32_8_, 0 < iVar16)) {
        local_308.data._M_elems[0xf]._1_3_ = local_998.data._M_elems[0xf]._1_3_;
        local_308.data._M_elems._56_5_ = local_998.data._M_elems._56_5_;
        local_308.data._M_elems[0xc] = local_998.data._M_elems[0xc];
        local_308.data._M_elems[0xd] = local_998.data._M_elems[0xd];
        local_308.data._M_elems[8] = local_998.data._M_elems[8];
        local_308.data._M_elems[9] = local_998.data._M_elems[9];
        local_308.data._M_elems[10] = local_998.data._M_elems[10];
        local_308.data._M_elems[0xb] = local_998.data._M_elems[0xb];
        local_308.data._M_elems[4] = local_998.data._M_elems[4];
        local_308.data._M_elems[5] = local_998.data._M_elems[5];
        local_308.data._M_elems[6] = local_998.data._M_elems[6];
        local_308.data._M_elems[7] = local_998.data._M_elems[7];
        local_308.data._M_elems[0] = local_998.data._M_elems[0];
        local_308.data._M_elems[1] = local_998.data._M_elems[1];
        local_308.data._M_elems[2] = local_998.data._M_elems[2];
        local_308.data._M_elems[3] = local_998.data._M_elems[3];
        local_308.exp = local_998.exp;
        local_308.neg = local_998.neg;
        local_308.fpclass = local_998.fpclass;
        local_308.prec_elem = local_998.prec_elem;
        pcVar20 = &local_9b8[iVar14].m_backend;
        if (local_9b8[iVar14].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
          local_aa8 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 4);
          local_a98 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 8);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          if (iVar16 == 0) {
            local_940[*local_938] = (int)local_9a0;
            *local_938 = *local_938 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar20,&local_308);
        uVar3 = local_998.data._M_elems._0_8_;
        uVar12 = local_998.data._M_elems._16_8_;
        uVar13 = local_998.data._M_elems._32_8_;
        if (pcVar20->fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
          local_aa8 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 4);
          local_a98 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 8);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          uVar3 = local_998.data._M_elems._0_8_;
          uVar12 = local_998.data._M_elems._16_8_;
          uVar13 = local_998.data._M_elems._32_8_;
          if (iVar16 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar20,1e-100);
            uVar3 = local_998.data._M_elems._0_8_;
            uVar12 = local_998.data._M_elems._16_8_;
            uVar13 = local_998.data._M_elems._32_8_;
          }
        }
      }
      local_998.data._M_elems._32_8_ = uVar13;
      local_998.data._M_elems._16_8_ = uVar12;
      local_998.data._M_elems._0_8_ = uVar3;
      local_a88[0] = local_a08.data._M_elems[0xc];
      local_a88[1] = local_a08.data._M_elems[0xd];
      stack0xfffffffffffff580 = local_a08.data._M_elems._56_5_;
      uStack_a7b = local_a08.data._M_elems[0xf]._1_3_;
      local_a98._0_4_ = local_a08.data._M_elems[8];
      local_a98._4_4_ = local_a08.data._M_elems[9];
      local_a98._8_4_ = local_a08.data._M_elems[10];
      local_a98._12_4_ = local_a08.data._M_elems[0xb];
      local_aa8._0_4_ = local_a08.data._M_elems[4];
      local_aa8._4_4_ = local_a08.data._M_elems[5];
      local_aa8._8_4_ = local_a08.data._M_elems[6];
      local_aa8._12_4_ = local_a08.data._M_elems[7];
      local_ab8._0_4_ = local_a08.data._M_elems[0];
      local_ab8._4_4_ = local_a08.data._M_elems[1];
      uVar3 = local_ab8._0_8_;
      local_ab8._8_4_ = local_a08.data._M_elems[2];
      local_ab8._12_4_ = local_a08.data._M_elems[3];
      local_358.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_358.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_358.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_358.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_358.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_358.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_358.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_358.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_358.exp = (eps2->m_backend).exp;
      local_358.neg = (eps2->m_backend).neg;
      local_358.fpclass = (eps2->m_backend).fpclass;
      local_358.prec_elem = (eps2->m_backend).prec_elem;
      iStack_a78 = local_a08.exp;
      bStack_a74 = local_a08.neg;
      local_a70._0_4_ = local_a08.fpclass;
      local_a70._4_4_ = local_a08.prec_elem;
      if ((local_a08.neg == true) &&
         (local_ab8._0_4_ = local_a08.data._M_elems[0],
         local_ab8._0_4_ != 0 || local_a08.fpclass != cpp_dec_float_finite)) {
        bStack_a74 = false;
      }
      if ((local_358.fpclass != cpp_dec_float_NaN && local_a08.fpclass != cpp_dec_float_NaN) &&
         (local_ab8._0_8_ = uVar3,
         iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_358), 0 < iVar16)) {
        local_3a8.data._M_elems[0xf]._1_3_ = local_a08.data._M_elems[0xf]._1_3_;
        local_3a8.data._M_elems._56_5_ = local_a08.data._M_elems._56_5_;
        local_3a8.data._M_elems[0xc] = local_a08.data._M_elems[0xc];
        local_3a8.data._M_elems[0xd] = local_a08.data._M_elems[0xd];
        local_3a8.data._M_elems[8] = local_a08.data._M_elems[8];
        local_3a8.data._M_elems[9] = local_a08.data._M_elems[9];
        local_3a8.data._M_elems[10] = local_a08.data._M_elems[10];
        local_3a8.data._M_elems[0xb] = local_a08.data._M_elems[0xb];
        local_3a8.data._M_elems[4] = local_a08.data._M_elems[4];
        local_3a8.data._M_elems[5] = local_a08.data._M_elems[5];
        local_3a8.data._M_elems[6] = local_a08.data._M_elems[6];
        local_3a8.data._M_elems[7] = local_a08.data._M_elems[7];
        local_3a8.data._M_elems[0] = local_a08.data._M_elems[0];
        local_3a8.data._M_elems[1] = local_a08.data._M_elems[1];
        local_3a8.data._M_elems[2] = local_a08.data._M_elems[2];
        local_3a8.data._M_elems[3] = local_a08.data._M_elems[3];
        local_3a8.exp = local_a08.exp;
        local_3a8.neg = local_a08.neg;
        local_3a8.fpclass = local_a08.fpclass;
        local_3a8.prec_elem = local_a08.prec_elem;
        pcVar20 = &local_9b0[iVar14].m_backend;
        if (local_9b0[iVar14].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8._0_8_ = *(undefined8 *)(pcVar19->data)._M_elems;
          local_ab8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 2);
          local_aa8._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 4);
          local_aa8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 6);
          local_a98._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 8);
          local_a98._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 10);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          if (iVar16 == 0) {
            ridx2[*rn2] = (int)local_9a0;
            *rn2 = *rn2 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar20,&local_3a8);
        if (pcVar20->fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8._0_8_ = *(undefined8 *)(pcVar19->data)._M_elems;
          local_ab8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 2);
          local_aa8._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 4);
          local_aa8._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 6);
          local_a98._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 8);
          local_a98._8_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 10);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          if (iVar16 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar20,1e-100);
          }
        }
      }
      local_a88[0] = local_a58.data._M_elems[0xc];
      local_a88[1] = local_a58.data._M_elems[0xd];
      stack0xfffffffffffff580 = local_a58.data._M_elems._56_5_;
      uStack_a7b = local_a58.data._M_elems[0xf]._1_3_;
      local_a98._8_4_ = local_a58.data._M_elems[10];
      local_a98._12_4_ = local_a58.data._M_elems[0xb];
      local_a98._0_4_ = local_a58.data._M_elems[8];
      local_a98._4_4_ = local_a58.data._M_elems[9];
      local_aa8._8_4_ = local_a58.data._M_elems[6];
      local_aa8._12_4_ = local_a58.data._M_elems[7];
      local_aa8._0_4_ = local_a58.data._M_elems[4];
      local_aa8._4_4_ = local_a58.data._M_elems[5];
      local_ab8._8_4_ = local_a58.data._M_elems[2];
      local_ab8._12_4_ = local_a58.data._M_elems[3];
      local_ab8._0_4_ = local_a58.data._M_elems[0];
      local_ab8._4_4_ = local_a58.data._M_elems[1];
      auVar4 = local_ab8;
      local_3f8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
      local_3f8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
      local_3f8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
      local_3f8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
      local_3f8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
      local_3f8.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
      local_3f8.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
      local_3f8.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
      local_3f8.exp = (eps3->m_backend).exp;
      local_3f8.neg = (eps3->m_backend).neg;
      local_3f8.fpclass = (eps3->m_backend).fpclass;
      local_3f8.prec_elem = (eps3->m_backend).prec_elem;
      iStack_a78 = local_a58.exp;
      bStack_a74 = local_a58.neg;
      local_a70._0_4_ = local_a58.fpclass;
      local_a70._4_4_ = local_a58.prec_elem;
      if ((local_a58.neg == true) &&
         (local_ab8._0_4_ = local_a58.data._M_elems[0],
         local_ab8._0_4_ != 0 || local_a58.fpclass != cpp_dec_float_finite)) {
        bStack_a74 = false;
      }
      if ((local_3f8.fpclass != cpp_dec_float_NaN && local_a58.fpclass != cpp_dec_float_NaN) &&
         (local_ab8 = auVar4,
         iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ab8,&local_3f8), 0 < iVar16)) {
        local_448.data._M_elems[0xf]._1_3_ = local_a58.data._M_elems[0xf]._1_3_;
        local_448.data._M_elems._56_5_ = local_a58.data._M_elems._56_5_;
        local_448.data._M_elems[0xc] = local_a58.data._M_elems[0xc];
        local_448.data._M_elems[0xd] = local_a58.data._M_elems[0xd];
        local_448.data._M_elems[8] = local_a58.data._M_elems[8];
        local_448.data._M_elems[9] = local_a58.data._M_elems[9];
        local_448.data._M_elems[10] = local_a58.data._M_elems[10];
        local_448.data._M_elems[0xb] = local_a58.data._M_elems[0xb];
        local_448.data._M_elems[4] = local_a58.data._M_elems[4];
        local_448.data._M_elems[5] = local_a58.data._M_elems[5];
        local_448.data._M_elems[6] = local_a58.data._M_elems[6];
        local_448.data._M_elems[7] = local_a58.data._M_elems[7];
        local_448.data._M_elems[0] = local_a58.data._M_elems[0];
        local_448.data._M_elems[1] = local_a58.data._M_elems[1];
        local_448.data._M_elems[2] = local_a58.data._M_elems[2];
        local_448.data._M_elems[3] = local_a58.data._M_elems[3];
        local_448.exp = local_a58.exp;
        local_448.neg = local_a58.neg;
        local_448.fpclass = local_a58.fpclass;
        local_448.prec_elem = local_a58.prec_elem;
        pcVar20 = &vec3[iVar14].m_backend;
        if (vec3[iVar14].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
          local_aa8 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 4);
          local_a98 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 8);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          if (iVar14 == 0) {
            ridx3[*rn3] = (int)local_9a0;
            *rn3 = *rn3 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar20,&local_448);
        if (pcVar20->fpclass != cpp_dec_float_NaN) {
          local_a70._0_4_ = cpp_dec_float_finite;
          local_a70._4_4_ = 0x10;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98 = (undefined1  [16])0x0;
          local_a88[0] = 0;
          local_a88[1] = 0;
          stack0xfffffffffffff580 = 0;
          uStack_a7b = 0;
          iStack_a78 = 0;
          bStack_a74 = false;
          pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ab8 = *(undefined1 (*) [16])(pcVar19->data)._M_elems;
          local_aa8 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 4);
          local_a98 = *(undefined1 (*) [16])((pcVar19->data)._M_elems + 8);
          local_a88._0_8_ = *(undefined8 *)((pcVar19->data)._M_elems + 0xc);
          uVar3 = *(undefined8 *)((pcVar19->data)._M_elems + 0xe);
          stack0xfffffffffffff580 = (undefined5)uVar3;
          uStack_a7b = (undefined3)((ulong)uVar3 >> 0x28);
          iStack_a78 = pcVar19->exp;
          bStack_a74 = pcVar19->neg;
          local_a70._0_4_ = pcVar19->fpclass;
          local_a70._4_4_ = pcVar19->prec_elem;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar20,(cpp_dec_float<100U,_int,_void> *)local_ab8);
          if (iVar14 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar20,1e-100);
          }
        }
      }
      local_a68 = uVar22 + 1;
    } while (local_a68 != local_920);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright3(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2,
   R* vec3, int* ridx3, int& rn3, R eps3)
{
   int i, j, k, n;
   int end;
   R x, x2, x3;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x = vec[j];
      x2 = vec2[j];
      x3 = vec3[j];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x2, eps2))
         {
            if(isNotZero(x3, eps3))
            {
               // case 1: all three vectors are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
                  ++val;
               }
            }
            else
            {
               // case 2: 1 and 2 are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  ++val;
               }
            }
         }
         else if(isNotZero(x3, eps3))
         {
            // case 3: 1 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 4: only 1 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x3, eps3))
         {
            // case 5: 2 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 6: only 2 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
      }
      else if(isNotZero(x3, eps3))
      {
         // case 7: only 3 is nonzero at j
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
            ++val;
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2, tmp3;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx] * (*val);
            tmp3 += vec3[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);
         x3 = R(tmp3);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);

         if(isNotZero(x3, eps3))
            updateSolutionVectorLright(x3, j, vec3[j], ridx3, rn3);
      }
   }
}